

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::XmlSerializer::ImportVertices(XmlSerializer *this,aiMesh *mesh)

{
  aiVector3t<float> *__src;
  iterator iVar1;
  bool bVar2;
  int iVar3;
  aiVector3D *__s;
  ulong uVar4;
  size_t __n;
  aiVector3D aVar5;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  aiVector3t<float> local_58;
  aiVector3t<float> *local_48;
  iterator iStack_40;
  aiVector3t<float> *local_38;
  
  local_48 = (aiVector3t<float> *)0x0;
  iStack_40._M_current = (aiVector3t<float> *)0x0;
  local_38 = (aiVector3t<float> *)0x0;
  while( true ) {
    bVar2 = ReadToEndElement(this,(string *)XmlTag::vertices_abi_cxx11_);
    iVar1._M_current = iStack_40._M_current;
    __src = local_48;
    if (!bVar2) break;
    (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = std::__cxx11::string::compare(XmlTag::vertex_abi_cxx11_);
    if (iVar3 == 0) {
      aVar5 = ReadVertex(this);
      local_58.z = aVar5.z;
      local_58._0_8_ = aVar5._0_8_;
      if (iStack_40._M_current == local_38) {
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_48,
                   iStack_40,&local_58);
      }
      else {
        (iStack_40._M_current)->z = local_58.z;
        (iStack_40._M_current)->x = local_58.x;
        (iStack_40._M_current)->y = local_58.y;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
    }
  }
  __n = (long)iStack_40._M_current - (long)local_48;
  uVar4 = (long)__n / 0xc;
  mesh->mNumVertices = (uint)uVar4;
  uVar4 = uVar4 & 0xffffffff;
  __s = (aiVector3D *)operator_new__(uVar4 * 0xc);
  if (uVar4 != 0) {
    memset(__s,0,((uVar4 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  mesh->mVertices = __s;
  if (iVar1._M_current != __src) {
    memmove(__s,__src,__n);
  }
  if (__src != (aiVector3t<float> *)0x0) {
    operator_delete(__src,(long)local_38 - (long)__src);
  }
  return;
}

Assistant:

void ImportVertices(aiMesh* mesh) {
        std::vector<aiVector3D> vertices;
        while(ReadToEndElement(D3MF::XmlTag::vertices)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::vertex) {
                vertices.push_back(ReadVertex());
            }
        }
        mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
        mesh->mVertices = new aiVector3D[mesh->mNumVertices];

        std::copy(vertices.begin(), vertices.end(), mesh->mVertices);
    }